

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O2

istream * libDAI::operator>>(istream *is,FactorGraph *fg)

{
  int iVar1;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var2;
  size_t sVar3;
  Exception *pEVar4;
  long lVar5;
  ulong uVar6;
  size_t mi_1;
  ulong uVar7;
  pointer pVVar8;
  allocator_type local_2b1;
  size_t nr_members;
  vector<long,_std::allocator<long>_> labels;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dims;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> factors;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vi;
  VarSet I_vars;
  value_type_conflict2 local_208;
  double val;
  size_t li;
  size_t nr_nonzeros;
  vector<long,_std::allocator<long>_> sigma;
  size_t nr_f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sdims;
  string line;
  vector<unsigned_long,_std::allocator<unsigned_long>_> svi;
  multind smi;
  multind mi;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  factors.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line._M_string_length = 0;
  factors.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  factors.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    iVar1 = std::istream::peek();
    if (iVar1 != 0x23) break;
    std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)&line);
  }
  std::istream::_M_extract<unsigned_long>((ulong *)is);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)&line);
    if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
      for (uVar6 = 0; uVar6 < nr_f; uVar6 = uVar6 + 1) {
        while( true ) {
          iVar1 = std::istream::peek();
          if (iVar1 != 0x23) break;
          std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)&line);
        }
        std::istream::_M_extract<unsigned_long>((ulong *)is);
        labels.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        labels.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        labels.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        for (uVar7 = 0; uVar7 < nr_members; uVar7 = uVar7 + 1) {
          while( true ) {
            iVar1 = std::istream::peek();
            if (iVar1 != 0x23) break;
            std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)&line);
          }
          std::istream::_M_extract<long>((long *)is);
          std::vector<long,_std::allocator<long>_>::push_back(&labels,(value_type_conflict5 *)&mi);
        }
        dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        for (uVar7 = 0; uVar7 < nr_members; uVar7 = uVar7 + 1) {
          while( true ) {
            iVar1 = std::istream::peek();
            if (iVar1 != 0x23) break;
            std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)&line);
          }
          std::istream::_M_extract<unsigned_long>((ulong *)is);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&dims,(value_type_conflict2 *)&mi);
        }
        I_vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        I_vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        I_vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        I_vars._statespace = 1;
        for (uVar7 = 0; uVar7 < nr_members; uVar7 = uVar7 + 1) {
          mi._dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)labels.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar7];
          mi._dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar7];
          VarSet::operator|=(&I_vars,(Var *)&mi);
        }
        TFactor<double>::TFactor((TFactor<double> *)&mi,&I_vars,0.0);
        std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
        emplace_back<libDAI::TFactor<double>>
                  ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
                   &factors,(TFactor<double> *)&mi);
        TFactor<double>::~TFactor((TFactor<double> *)&mi);
        mi._dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<long,_std::allocator<long>_>::vector
                  (&sigma,nr_members,(value_type_conflict5 *)&mi,(allocator_type *)&smi);
        pVVar8 = I_vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar7 = 0; uVar7 < nr_members; uVar7 = uVar7 + 1) {
          mi._dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pVVar8->_label;
          _Var2 = std::
                  __find_if<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_equals_val<long_const>>
                            (labels.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             labels.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_finish,(TFactor<double> *)&mi);
          pVVar8 = pVVar8 + 1;
          sigma.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar7] =
               (long)_Var2._M_current -
               (long)labels.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
        }
        mi._dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&sdims,nr_members,(value_type_conflict2 *)&mi,(allocator_type *)&smi);
        for (uVar7 = 0; uVar7 < nr_members; uVar7 = uVar7 + 1) {
          sdims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] =
               dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start
               [sigma.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7]];
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,&dims);
        multind::multind(&mi,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_60);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,&sdims);
        multind::multind(&smi,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
        while( true ) {
          iVar1 = std::istream::peek();
          if (iVar1 != 0x23) break;
          std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)&line);
        }
        std::istream::_M_extract<unsigned_long>((ulong *)is);
        for (uVar7 = 0; uVar7 < nr_nonzeros; uVar7 = uVar7 + 1) {
          while( true ) {
            iVar1 = std::istream::peek();
            if (iVar1 != 0x23) break;
            std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)&line);
          }
          std::istream::_M_extract<unsigned_long>((ulong *)is);
          while( true ) {
            iVar1 = std::istream::peek();
            if (iVar1 != 0x23) break;
            std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)&line);
          }
          std::istream::_M_extract<double>((double *)is);
          multind::vi(&vi,&mi,li);
          local_208 = 0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&svi,(long)vi.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)vi.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3,&local_208,&local_2b1
                    );
          for (lVar5 = 0;
              (long)vi.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)vi.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3 != lVar5; lVar5 = lVar5 + 1) {
            svi.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5] =
                 vi.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [sigma.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5]];
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,&svi);
          sVar3 = multind::li(&smi,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &local_48);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48)
          ;
          factors.
          super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1]._p._p.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar3] = val;
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&svi.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&vi.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        }
        multind::~multind(&smi);
        multind::~multind(&mi);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&sdims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  (&sigma.super__Vector_base<long,_std::allocator<long>_>);
        std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                  ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&I_vars);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  (&labels.super__Vector_base<long,_std::allocator<long>_>);
      }
      FactorGraph::FactorGraph((FactorGraph *)&mi,&factors);
      FactorGraph::operator=(fg,(FactorGraph *)&mi);
      FactorGraph::~FactorGraph((FactorGraph *)&mi);
      std::__cxx11::string::~string((string *)&line);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
                (&factors);
      return is;
    }
    pEVar4 = (Exception *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mi,"factorgraph.cpp, line 117",(allocator<char> *)&smi);
    Exception::Exception(pEVar4,7,(string *)&mi);
    __cxa_throw(pEVar4,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  pEVar4 = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mi,"factorgraph.cpp, line 111",(allocator<char> *)&smi);
  Exception::Exception(pEVar4,7,(string *)&mi);
  __cxa_throw(pEVar4,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::istream& operator >> (std::istream& is, FactorGraph& fg) {
        long verbose = 0;

        try {
            vector<Factor> factors;
            size_t nr_f;
            string line;
            
            while( (is.peek()) == '#' )
                getline(is,line);
            is >> nr_f;
            if( is.fail() )
                DAI_THROW(INVALID_FACTORGRAPH_FILE);
            if( verbose >= 2 )
                cout << "Reading " << nr_f << " factors..." << endl;

            getline (is,line);
            if( is.fail() )
                DAI_THROW(INVALID_FACTORGRAPH_FILE);

            for( size_t I = 0; I < nr_f; I++ ) {
                if( verbose >= 3 )
                    cout << "Reading factor " << I << "..." << endl;
                size_t nr_members;
                while( (is.peek()) == '#' )
                    getline(is,line);
                is >> nr_members;
                if( verbose >= 3 )
                    cout << "  nr_members: " << nr_members << endl;

                vector<long> labels;
                for( size_t mi = 0; mi < nr_members; mi++ ) {
                    long mi_label;
                    while( (is.peek()) == '#' )
                        getline(is,line);
                    is >> mi_label;
                    labels.push_back(mi_label);
                }
                if( verbose >= 3 ) {
                    cout << "  labels: ";
                    copy (labels.begin(), labels.end(), ostream_iterator<int>(cout, " "));
                    cout << endl;
                }

                vector<size_t> dims;
                for( size_t mi = 0; mi < nr_members; mi++ ) {
                    size_t mi_dim;
                    while( (is.peek()) == '#' )
                        getline(is,line);
                    is >> mi_dim;
                    dims.push_back(mi_dim);
                }
                if( verbose >= 3 ) {
                    cout << "  dimensions: ";
                    copy (dims.begin(), dims.end(), ostream_iterator<int>(cout, " "));
                    cout << endl;
                }

                // add the Factor
                VarSet I_vars;
                for( size_t mi = 0; mi < nr_members; mi++ )
                    I_vars |= Var(labels[mi], dims[mi]);
                factors.push_back(Factor(I_vars,0.0));
                
                // calculate permutation sigma (internally, members are sorted)
                vector<long> sigma(nr_members,0);
                VarSet::iterator j = I_vars.begin();
                for( size_t mi = 0; mi < nr_members; mi++,j++ ) {
                    long search_for = j->label();
                    vector<long>::iterator j_loc = find(labels.begin(),labels.end(),search_for);
                    sigma[mi] = j_loc - labels.begin();
                }
                if( verbose >= 3 ) {
                    cout << "  sigma: ";
                    copy( sigma.begin(), sigma.end(), ostream_iterator<int>(cout," "));
                    cout << endl;
                }

                // calculate multindices
                vector<size_t> sdims(nr_members,0);
                for( size_t k = 0; k < nr_members; k++ ) {
                    sdims[k] = dims[sigma[k]];
                }
                multind mi(dims);
                multind smi(sdims);
                if( verbose >= 3 ) {
                    cout << "  mi.max(): " << mi.max() << endl;
                    cout << "       ";
                    for( size_t k=0; k < nr_members; k++ ) 
                        cout << labels[k] << " ";
                    cout << "   ";
                    for( size_t k=0; k < nr_members; k++ ) 
                        cout << labels[sigma[k]] << " ";
                    cout << endl;
                }
                
                // read values
                size_t nr_nonzeros;
                while( (is.peek()) == '#' )
                    getline(is,line);
                is >> nr_nonzeros;
                if( verbose >= 3 ) 
                    cout << "  nonzeroes: " << nr_nonzeros << endl;
                for( size_t k = 0; k < nr_nonzeros; k++ ) {
                    size_t li;
                    double val;
                    while( (is.peek()) == '#' )
                        getline(is,line);
                    is >> li;
                    while( (is.peek()) == '#' )
                        getline(is,line);
                    is >> val;

                    vector<size_t> vi = mi.vi(li);
                    vector<size_t> svi(vi.size(),0);
                    for( size_t k = 0; k < vi.size(); k++ )
                        svi[k] = vi[sigma[k]];
                    size_t sli = smi.li(svi);
                    if( verbose >= 3 ) {
                        cout << "    " << li << ": ";
                        copy( vi.begin(), vi.end(), ostream_iterator<size_t>(cout," "));
                        cout << "-> ";
                        copy( svi.begin(), svi.end(), ostream_iterator<size_t>(cout," "));
                        cout << ": " << sli << endl;
                    }
                    factors.back()[sli] = val;
                }
            }

            if( verbose >= 3 ) {
                cout << "factors:" << endl;
                copy(factors.begin(), factors.end(), ostream_iterator<Factor>(cout,"\n"));
            }

            fg = FactorGraph(factors);
        } catch (char *e) {
            cout << e << endl;
        }

        return is;
    }